

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

void __thiscall LinearScan::TrackInlineeArgLifetimes(LinearScan *this,Instr *instr)

{
  uint uVar1;
  uint32 uVar2;
  InlineeFrameInfo *this_00;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  Func **ppFVar6;
  undefined4 *puVar7;
  Func *pFVar8;
  JITTimeFunctionBody *this_01;
  intptr_t functionBodyAddr;
  Func *func;
  Instr *instr_local;
  LinearScan *this_local;
  
  if (instr->m_opcode == InlineeStart) {
    if ((*(uint *)&instr->m_func->field_0x240 >> 1 & 1) == 0) {
      pFVar8 = Func::GetParentFunc(instr->m_func);
      if ((*(uint *)&pFVar8->field_0x240 >> 1 & 1) != 0) {
        if (instr->m_func->frameInfo != (InlineeFrameInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0xd95,"(!instr->m_func->frameInfo)","!instr->m_func->frameInfo");
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        if (instr->m_func->cachedInlineeFrameInfo == (InlineeFrameInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0xd96,"(instr->m_func->cachedInlineeFrameInfo)",
                             "instr->m_func->cachedInlineeFrameInfo");
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        bVar4 = JsUtil::ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>::Empty
                          (&(this->currentBlock->inlineeStack).
                            super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>);
        if ((!bVar4) &&
           (uVar2 = instr->m_func->inlineDepth,
           ppFVar6 = JsUtil::
                     List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     ::Last(&this->currentBlock->inlineeStack), uVar2 != (*ppFVar6)->inlineDepth + 1
           )) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0xd98,
                             "(this->currentBlock->inlineeStack.Empty() || instr->m_func->inlineDepth == this->currentBlock->inlineeStack.Last()->inlineDepth + 1)"
                             ,
                             "this->currentBlock->inlineeStack.Empty() || instr->m_func->inlineDepth == this->currentBlock->inlineeStack.Last()->inlineDepth + 1"
                            );
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        JsUtil::
        List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
                  (&this->currentBlock->inlineeStack,&instr->m_func);
      }
    }
    else {
      InlineeFrameInfo::IterateSyms<LinearScan::TrackInlineeArgLifetimes(IR::Instr*)::__0>
                (instr->m_func->frameInfo,(anon_class_8_1_8991fb9c_for_callback)this,false);
      iVar5 = JsUtil::ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>::Count
                        (&(this->currentBlock->inlineeStack).
                          super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>);
      if ((0 < iVar5) &&
         (uVar1 = instr->m_func->inlineDepth,
         ppFVar6 = JsUtil::
                   List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   ::Last(&this->currentBlock->inlineeStack), uVar1 <= (*ppFVar6)->inlineDepth)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0xd8f,
                           "(instr->m_func->inlineDepth > this->currentBlock->inlineeStack.Last()->inlineDepth)"
                           ,
                           "instr->m_func->inlineDepth > this->currentBlock->inlineeStack.Last()->inlineDepth"
                          );
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      JsUtil::List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::Add(&this->currentBlock->inlineeStack,&instr->m_func);
    }
  }
  else if (((instr->m_opcode == InlineeEnd) || (bVar4 = IR::Instr::HasBailOnNoProfile(instr), bVar4)
           ) && (((*(uint *)&instr->m_func->field_0x240 >> 1 & 1) != 0 ||
                 ((pFVar8 = Func::GetParentFunc(instr->m_func), pFVar8 != (Func *)0x0 &&
                  (pFVar8 = Func::GetParentFunc(instr->m_func),
                  (*(uint *)&pFVar8->field_0x240 >> 1 & 1) != 0)))))) {
    if ((*(uint *)&instr->m_func->field_0x240 >> 1 & 1) == 0) {
      if (instr->m_func->cachedInlineeFrameInfo == (InlineeFrameInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0xda3,"(instr->m_func->cachedInlineeFrameInfo)",
                           "instr->m_func->cachedInlineeFrameInfo");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      instr->m_func->frameInfo = instr->m_func->cachedInlineeFrameInfo;
    }
    this_00 = instr->m_func->frameInfo;
    pFVar8 = instr->m_func;
    this_01 = Func::GetJITFunctionBody(instr->m_func);
    functionBodyAddr = JITTimeFunctionBody::GetAddr(this_01);
    InlineeFrameInfo::AllocateRecord(this_00,pFVar8,functionBodyAddr);
    iVar5 = JsUtil::ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>::Count
                      (&(this->currentBlock->inlineeStack).
                        super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>);
    if (iVar5 == 0) {
      iVar5 = JsUtil::ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>::Count
                        ((ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer> *)
                         this->currentBlock);
      if (iVar5 != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0xdab,"(this->currentBlock->inlineeFrameLifetimes.Count() == 0)",
                           "this->currentBlock->inlineeFrameLifetimes.Count() == 0");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      iVar5 = JsUtil::
              BaseDictionary<unsigned_int,_unsigned_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::Count(&this->currentBlock->inlineeFrameSyms);
      if (iVar5 != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0xdac,"(this->currentBlock->inlineeFrameSyms.Count() == 0)",
                           "this->currentBlock->inlineeFrameSyms.Count() == 0");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
    }
    else {
      pFVar8 = JsUtil::
               List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::RemoveAtEnd(&this->currentBlock->inlineeStack);
      if (pFVar8 != instr->m_func) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0xdb1,"(func == instr->m_func)","func == instr->m_func");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      if ((*(uint *)&instr->m_func->field_0x240 >> 1 & 1) != 0) {
        InlineeFrameInfo::IterateSyms<LinearScan::TrackInlineeArgLifetimes(IR::Instr*)::__1>
                  (instr->m_func->frameInfo,(anon_class_8_1_8991fb9c_for_callback)this,true);
      }
    }
  }
  return;
}

Assistant:

void LinearScan::TrackInlineeArgLifetimes(IR::Instr* instr)
{
    if (instr->m_opcode == Js::OpCode::InlineeStart)
    {
        if (instr->m_func->m_hasInlineArgsOpt)
        {
            instr->m_func->frameInfo->IterateSyms([=](StackSym* sym){
                Lifetime* lifetime = sym->scratch.linearScan.lifetime;
                this->currentBlock->inlineeFrameLifetimes.Add(lifetime);

                // We need to maintain as count because the same sym can be used for multiple arguments
                uint* value;
                if (this->currentBlock->inlineeFrameSyms.TryGetReference(sym->m_id, &value))
                {
                    *value = *value + 1;
                }
                else
                {
                    this->currentBlock->inlineeFrameSyms.Add(sym->m_id, 1);
                }
            });
            if (this->currentBlock->inlineeStack.Count() > 0)
            {
                Assert(instr->m_func->inlineDepth > this->currentBlock->inlineeStack.Last()->inlineDepth);
            }
            this->currentBlock->inlineeStack.Add(instr->m_func);
        }
        else if (instr->m_func->GetParentFunc()->m_hasInlineArgsOpt)
        {
            Assert(!instr->m_func->frameInfo);
            Assert(instr->m_func->cachedInlineeFrameInfo);
            
            Assert(this->currentBlock->inlineeStack.Empty() || instr->m_func->inlineDepth == this->currentBlock->inlineeStack.Last()->inlineDepth + 1);

            this->currentBlock->inlineeStack.Add(instr->m_func);
        }
    }
    else if (instr->m_opcode == Js::OpCode::InlineeEnd || instr->HasBailOnNoProfile())
    {
        if (instr->m_func->m_hasInlineArgsOpt || (instr->m_func->GetParentFunc() && instr->m_func->GetParentFunc()->m_hasInlineArgsOpt))
        {
            if (!instr->m_func->m_hasInlineArgsOpt)
            {
                Assert(instr->m_func->cachedInlineeFrameInfo);
                instr->m_func->frameInfo = instr->m_func->cachedInlineeFrameInfo;
            }
            instr->m_func->frameInfo->AllocateRecord(instr->m_func, instr->m_func->GetJITFunctionBody()->GetAddr());

            if(this->currentBlock->inlineeStack.Count() == 0)
            {
                // Block is unreachable
                Assert(this->currentBlock->inlineeFrameLifetimes.Count() == 0);
                Assert(this->currentBlock->inlineeFrameSyms.Count() == 0);
            }
            else
            {
                Func* func = this->currentBlock->inlineeStack.RemoveAtEnd();
                Assert(func == instr->m_func);

                if (instr->m_func->m_hasInlineArgsOpt)
                {
                    instr->m_func->frameInfo->IterateSyms([=](StackSym* sym) {
                        Lifetime* lifetime = this->currentBlock->inlineeFrameLifetimes.RemoveAtEnd();

                        uint* value;
                        if (this->currentBlock->inlineeFrameSyms.TryGetReference(sym->m_id, &value))
                        {
                            *value = *value - 1;
                            if (*value == 0)
                            {
                                bool removed = this->currentBlock->inlineeFrameSyms.Remove(sym->m_id);
                                Assert(removed);
                            }
                        }
                        else
                        {
                            Assert(UNREACHED);
                        }
                        Assert(sym->scratch.linearScan.lifetime == lifetime);
                        }, /*reverse*/ true);
                }
            }
        }
    }
}